

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setWindowFilePath_helper(QWidgetPrivate *this,QString *filePath)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x360523);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x36052f);
  if (bVar2) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x360543);
    std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
              ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x36054f);
    bVar2 = QString::isEmpty((QString *)0x36055b);
    if (bVar2) {
      this_00 = q_func(in_RDI);
      QWidget::windowTitle(this_00);
      setWindowTitle_helper(in_RSI,(QString *)this_00);
      QString::~QString((QString *)0x360598);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setWindowFilePath_helper(const QString &filePath)
{
    if (extra->topextra && extra->topextra->caption.isEmpty()) {
#ifdef Q_OS_MAC
        setWindowTitle_helper(QFileInfo(filePath).fileName());
#else
        Q_Q(QWidget);
        Q_UNUSED(filePath);
        setWindowTitle_helper(q->windowTitle());
#endif
    }
#ifdef Q_OS_MAC
    setWindowFilePath_sys(filePath);
#endif
}